

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.cpp
# Opt level: O0

void __thiscall
HuffTree::add_code(HuffTree *this,char data,vector<bool,_std::allocator<bool>_> *code)

{
  bool bVar1;
  pointer pTVar2;
  vector<bool,_std::allocator<bool>_> *in_RDX;
  undefined1 in_SIL;
  TreeNode *in_RDI;
  iterator iVar3;
  bool bit;
  iterator __end1;
  iterator __begin1;
  vector<bool,_std::allocator<bool>_> *__range1;
  _Bit_iterator_base *in_stack_fffffffffffffef8;
  TreeNode *in_stack_ffffffffffffff00;
  _Bit_iterator_base local_e8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  TreeNode local_a8;
  reference local_78;
  undefined1 local_61;
  _Bit_type *local_60;
  uint local_58;
  _Bit_type *local_50;
  uint local_48;
  _Bit_type *local_40;
  uint local_38;
  _Bit_type *local_30;
  uint local_28;
  vector<bool,_std::allocator<bool>_> *local_20;
  undefined1 local_9;
  
  local_9 = in_SIL;
  back_to_root((HuffTree *)in_stack_ffffffffffffff00);
  local_20 = in_RDX;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)0x11ada2);
  local_40 = iVar3.super__Bit_iterator_base._M_p;
  local_38 = iVar3.super__Bit_iterator_base._M_offset;
  local_30 = local_40;
  local_28 = local_38;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end(local_20);
  local_60 = iVar3.super__Bit_iterator_base._M_p;
  local_58 = iVar3.super__Bit_iterator_base._M_offset;
  local_50 = local_60;
  local_48 = local_58;
  while( true ) {
    bVar1 = std::operator!=((_Bit_iterator_base *)in_stack_ffffffffffffff00,
                            in_stack_fffffffffffffef8);
    if (!bVar1) break;
    local_78 = std::_Bit_iterator::operator*((_Bit_iterator *)0x11ae34);
    local_61 = std::_Bit_reference::operator_cast_to_bool(&local_78);
    if ((bool)local_61) {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *
                         )0x11ae79);
      if (!bVar1) {
        *(undefined1 *)(*(long *)in_RDI + 0x18) = 0;
        local_a8._right._M_t.
        super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
        super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
        super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
             (__uniq_ptr_data<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>,_true,_true>
              )(__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
        local_a8._is_leaf = false;
        local_a8._25_7_ = 0;
        local_a8._data = '\0';
        local_a8._1_3_ = 0;
        local_a8._freq = 0;
        local_a8._left._M_t.
        super___uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>._M_t.
        super__Tuple_impl<0UL,_HuffTree::TreeNode_*,_std::default_delete<HuffTree::TreeNode>_>.
        super__Head_base<0UL,_HuffTree::TreeNode_*,_false>._M_head_impl =
             (__uniq_ptr_data<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>,_true,_true>
              )(__uniq_ptr_impl<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>)0x0;
        in_stack_ffffffffffffff00 = &local_a8;
        TreeNode::TreeNode(in_stack_ffffffffffffff00);
        std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>(in_RDI);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::operator=
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_ffffffffffffff00,
                   (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_fffffffffffffef8);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_ffffffffffffff00);
        TreeNode::~TreeNode(in_stack_ffffffffffffff00);
      }
      pTVar2 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                         ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
                           *)in_stack_ffffffffffffff00);
      *(pointer *)in_RDI = pTVar2;
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *
                         )0x11af3e);
      if (!bVar1) {
        *(undefined1 *)(*(long *)in_RDI + 0x18) = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8._M_p = (_Bit_type *)0x0;
        local_e8._M_offset = 0;
        local_e8._12_4_ = 0;
        in_stack_fffffffffffffef8 = &local_e8;
        TreeNode::TreeNode(in_stack_ffffffffffffff00);
        std::make_unique<HuffTree::TreeNode,HuffTree::TreeNode>(in_RDI);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::operator=
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_ffffffffffffff00,
                   (unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_fffffffffffffef8);
        std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
                  ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *)
                   in_stack_ffffffffffffff00);
        TreeNode::~TreeNode(in_stack_ffffffffffffff00);
      }
      pTVar2 = std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::get
                         ((unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>
                           *)in_stack_ffffffffffffff00);
      *(pointer *)in_RDI = pTVar2;
    }
    std::_Bit_iterator::operator++((_Bit_iterator *)in_stack_ffffffffffffff00);
  }
  **(undefined1 **)in_RDI = local_9;
  *(undefined1 *)(*(long *)in_RDI + 0x18) = 1;
  return;
}

Assistant:

void HuffTree::add_code(char data, std::vector<bool> code) {
    back_to_root();
    for (bool bit : code) {
        if (bit) {
            if (!curr_node->_right) {
                curr_node->_is_leaf = false;
                curr_node->_right = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_right.get();
        } else {
            if (!curr_node->_left) {
                curr_node->_is_leaf = false;
                curr_node->_left = std::make_unique<TreeNode>(TreeNode());
            }
            curr_node = curr_node->_left.get();
        }
    }
    curr_node->_data = data;
    curr_node->_is_leaf = true;
}